

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O3

CppLogger * __thiscall
CppLogger::CppLogger::printFormat(CppLogger *this,Level t_Level,string *t_Message)

{
  size_type *psVar1;
  ostream *poVar2;
  tm *__tp;
  size_t sVar3;
  undefined8 *in_RCX;
  long lVar4;
  undefined4 in_register_00000034;
  char *pcVar5;
  pointer pFVar6;
  int iVar7;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> format;
  time_t currTime;
  char time [100];
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_c8;
  long local_b0;
  undefined8 *local_a8;
  time_t local_a0;
  char local_98 [104];
  
  local_b0 = CONCAT44(in_register_00000034,t_Level);
  iVar7 = (int)t_Message + -1;
  local_a8 = in_RCX;
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            (&local_c8,
             (vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
             (local_b0 + (long)iVar7 * 0x18 + 0x28));
  std::__cxx11::stringstream::stringstream((stringstream *)this);
  if (local_c8.
      super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_c8.
      super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = &(this->m_Name)._M_string_length;
    pFVar6 = local_c8.
             super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      switch(*pFVar6) {
      case Name:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"[",1);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)psVar1,*(char **)(local_b0 + 8),*(long *)(local_b0 + 0x10));
        lVar4 = 2;
        pcVar5 = "] ";
        break;
      case Time:
        ::time(&local_a0);
        __tp = localtime(&local_a0);
        strftime(local_98,0x32,"%T",__tp);
        sVar3 = strlen(local_98);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,local_98,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," ",1);
        goto switchD_00103bdb_default;
      case Level:
        lVar4 = 8;
        poVar2 = (ostream *)psVar1;
        switch(iVar7) {
        case 0:
          pcVar5 = "(Trace) ";
          break;
        case 1:
          lVar4 = 7;
          pcVar5 = "(Info) ";
          break;
        case 2:
          lVar4 = 7;
          pcVar5 = "(Warn) ";
          break;
        case 3:
          pcVar5 = "(Error) ";
          break;
        case 4:
          lVar4 = 0xe;
          pcVar5 = "(Fatal Error) ";
          break;
        default:
          goto switchD_00103bdb_default;
        }
        break;
      case Message:
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)psVar1,(char *)*local_a8,local_a8[1]);
        lVar4 = 1;
        pcVar5 = " ";
        break;
      default:
        goto switchD_00103bdb_default;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
switchD_00103bdb_default:
      pFVar6 = pFVar6 + 1;
    } while (pFVar6 != local_c8.
                       super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_c8.
      super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

std::stringstream CppLogger::printFormat(Level t_Level, std::string t_Message) {
        std::vector<FormatAttribute > format = m_Format[t_Level - 1].getFormat();
        std::stringstream sstr;
        for (const auto &attribute : format) {
            switch (attribute) {
                case FormatAttribute::None:
                    break;
                case FormatAttribute::Name:
                    sstr << "[" << m_Name << "] ";
                    break;
                case FormatAttribute::Time: {
                    std::time_t currTime;
                    std::tm * currTm;
                    std::time(&currTime);
                    currTm = std::localtime(&currTime);

                    char time[100];
                    std::strftime(time, 50, "%T", currTm);
                    sstr << time << " ";
                    break;
                }
                case FormatAttribute::Level: {
                    switch (t_Level) {
                        case None:
                            break;
                        case Trace:
                            sstr << "(Trace) ";
                            break;
                        case Info:
                            sstr << "(Info) ";
                            break;
                        case Warn:
                            sstr << "(Warn) ";
                            break;
                        case Error:
                            sstr << "(Error) ";
                            break;
                        case FatalError:
                            sstr << "(Fatal Error) ";
                            break;
                    }
                    break;
                }
                case FormatAttribute::Message:
                    sstr << t_Message << " ";
                    break;
            }
        }
        return sstr;
    }